

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QStretchParameter>::detachAndGrow
          (QArrayDataPointer<QStretchParameter> *this,GrowthPosition where,qsizetype n,
          QStretchParameter **data,QArrayDataPointer<QStretchParameter> *old)

{
  Data *pDVar1;
  bool bVar2;
  GrowthPosition pos;
  
  pDVar1 = this->d;
  if ((pDVar1 != (Data *)0x0) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (n != 0) {
      if (where == GrowsAtEnd) {
        if (n <= (pDVar1->super_QArrayData).alloc -
                 (((long)((long)this->ptr -
                         ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0
                         )) >> 3) + this->size)) {
          return;
        }
        pos = GrowsAtEnd;
      }
      else {
        pos = where;
        if ((where == GrowsAtBeginning) &&
           (n <= (long)((long)this->ptr -
                       ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
                 >> 3)) {
          return;
        }
      }
      bVar2 = tryReadjustFreeSpace(this,pos,n,data);
      if (!bVar2) goto LAB_0053a1bd;
    }
    return;
  }
LAB_0053a1bd:
  reallocateAndGrow(this,where,n,old);
  return;
}

Assistant:

void detachAndGrow(QArrayData::GrowthPosition where, qsizetype n, const T **data,
                       QArrayDataPointer *old)
    {
        const bool detach = needsDetach();
        bool readjusted = false;
        if (!detach) {
            if (!n || (where == QArrayData::GrowsAtBeginning && freeSpaceAtBegin() >= n)
                || (where == QArrayData::GrowsAtEnd && freeSpaceAtEnd() >= n))
                return;
            readjusted = tryReadjustFreeSpace(where, n, data);
            Q_ASSERT(!readjusted
                     || (where == QArrayData::GrowsAtBeginning && freeSpaceAtBegin() >= n)
                     || (where == QArrayData::GrowsAtEnd && freeSpaceAtEnd() >= n));
        }

        if (!readjusted)
            reallocateAndGrow(where, n, old);
    }